

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,MessageBuilder *builder)

{
  IResultCapture *pIVar1;
  long in_RDI;
  MessageInfo *in_stack_ffffffffffffff98;
  MessageInfo *in_stack_ffffffffffffffa0;
  string *this_00;
  string local_30 [48];
  
  MessageInfo::MessageInfo(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *(undefined1 *)(in_RDI + 0x48) = 0;
  ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_ffffffffffffff98);
  this_00 = local_30;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x10),this_00);
  std::__cxx11::string::~string(this_00);
  pIVar1 = getResultCapture();
  (*pIVar1->_vptr_IResultCapture[6])(pIVar1,in_RDI);
  return;
}

Assistant:

ScopedMessage::ScopedMessage( MessageBuilder const& builder )
    : m_info( builder.m_info ), m_moved()
    {
        m_info.message = builder.m_stream.str();
        getResultCapture().pushScopedMessage( m_info );
    }